

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncMax(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  pointer pEVar1;
  ExpressionValueType EVar2;
  anon_union_8_2_b358304e_for_ExpressionValue_1 *paVar3;
  ExpressionValue *result;
  double dVar4;
  long lVar5;
  double dVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar2 = Integer;
  lVar5 = (long)(parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1;
  if (lVar5 == 0) {
    dVar6 = -0.0;
  }
  else {
    dVar4 = -0.0;
    lVar5 = (lVar5 >> 4) * -0x5555555555555555;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    paVar3 = &pEVar1->field_1;
    dVar9 = 2.2250738585072014e-308;
    bVar7 = true;
    dVar6 = -0.0;
    do {
      if (((ExpressionValue *)(paVar3 + -1))->type == Float) {
        dVar8 = paVar3->floatValue;
        bVar7 = false;
      }
      else {
        if (((ExpressionValue *)(paVar3 + -1))->type != Integer) {
          return __return_storage_ptr__;
        }
        dVar4 = (double)paVar3->intValue;
        dVar8 = (double)(long)dVar4;
      }
      if ((long)dVar6 < (long)dVar4) {
        dVar6 = dVar4;
      }
      if (dVar8 <= dVar9) {
        dVar8 = dVar9;
      }
      dVar9 = dVar8;
      paVar3 = paVar3 + 6;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (!bVar7) {
      EVar2 = Float;
      dVar6 = dVar9;
    }
  }
  (__return_storage_ptr__->field_1).floatValue = dVar6;
  __return_storage_ptr__->type = EVar2;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncMax(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	double floatMax, floatCur;
	int64_t intMax, intCur;

	floatCur = floatMax = std::numeric_limits<double>::min();
	intCur = intMax = std::numeric_limits<int64_t>::min();
	bool isInt = true;

	for (size_t i = 0; i < parameters.size(); i++)
	{
		switch (parameters[i].type)
		{
		case ExpressionValueType::Integer:
			intCur = parameters[i].intValue;
			floatCur = (double)parameters[i].intValue;
			break;
		case ExpressionValueType::Float:
			floatCur = parameters[i].floatValue;
			isInt = false;
			break;
		default:
			return result;
		}

		if (intCur > intMax)
			intMax = intCur;
		if (floatCur > floatMax)
			floatMax = floatCur;
	}

	if (isInt)
	{
		result.intValue = intMax;
		result.type = ExpressionValueType::Integer;
	}
	else
	{
		result.floatValue = floatMax;
		result.type = ExpressionValueType::Float;
	}

	return result;
}